

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

type chaiscript::Boxed_Number::go<long_double,long>
               (Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar4;
  type tVar5;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  element_type *t;
  undefined4 in_stack_ffffffffffffff88;
  Opers in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  Opers t_oper_00;
  unkbyte10 in_stack_ffffffffffffff98;
  longdouble *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd2;
  Opers in_stack_ffffffffffffffdc;
  
  t_oper_00 = (Opers)((unkuint10)in_stack_ffffffffffffff98 >> 0x20);
  if ((in_ESI < 1) || (6 < in_ESI)) {
    if ((7 < in_ESI) && (in_ESI < 0xf)) {
      bVar1 = Boxed_Value::is_const((Boxed_Value *)0x1f9552);
      if (!bVar1) {
        bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x1f9563);
        if (!bVar1) {
          Boxed_Value::get_ptr((Boxed_Value *)0x1f957f);
          get_as_aux<long_double,long>((Boxed_Value *)CONCAT44(in_ESI,in_stack_ffffffffffffff60));
          BVar4 = binary_go<long_double,long_double>
                            (t_oper_00,
                             (longdouble *)
                             CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                             (longdouble *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (Boxed_Value *)in_RDI);
          _Var3._M_pi = BVar4.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          goto LAB_001f9635;
        }
      }
    }
    if (in_ESI < 0x1f) {
      uVar2 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast
                ((bad_any_cast *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    get_as_aux<long_double,long_double>((Boxed_Value *)0x1f95d9);
    get_as_aux<long_double,long>((Boxed_Value *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
    BVar4 = const_binary_go<long_double>
                      (in_stack_ffffffffffffffdc,
                       (longdouble *)CONCAT62(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    t = in_RDI;
    get_as_aux<long_double,long_double>((Boxed_Value *)0x1f94ff);
    get_as_aux<long_double,long>
              ((Boxed_Value *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    BVar4 = boolean_go<long_double>(in_stack_ffffffffffffff8c,(longdouble *)t,(longdouble *)in_RDI);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    in_RDI = t;
  }
LAB_001f9635:
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (type)tVar5.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) 
          -> typename std::enable_if<std::is_floating_point<LHS>::value || std::is_floating_point<RHS>::value, Boxed_Value>::type
      {
        typedef typename std::common_type<LHS, RHS>::type common_type;
        if (t_oper > Operators::boolean_flag && t_oper < Operators::non_const_flag)
        {
          return boolean_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return binary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), get_as_aux<common_type, RHS>(t_rhs), t_lhs);
        } else if (t_oper > Operators::const_flag) {
          return const_binary_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }